

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O3

vm_obj_id_t CVmObjPattern::create_from_stack(uchar **pc_ptr,uint argc)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_val_t *pvVar2;
  re_status_t rVar3;
  vm_obj_id_t obj_id;
  int iVar4;
  ushort *puVar5;
  undefined8 *puVar6;
  undefined4 extraout_var;
  re_compiled_pattern *pat;
  re_compiled_pattern *local_30;
  long lVar7;
  
  if (argc != 1) {
    err_throw(0x899);
  }
  puVar5 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
  if (puVar5 != (ushort *)0x0) {
    rVar3 = CRegexParser::compile_pattern
                      (G_bif_tads_globals_X->rex_parser,(char *)(puVar5 + 1),(ulong)*puVar5,
                       &local_30);
    if (rVar3 == RE_STATUS_SUCCESS) {
      obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,1,0);
      puVar6 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
      pvVar2 = sp_;
      *puVar6 = &PTR_get_metaclass_reg_00368290;
      iVar4 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,puVar6);
      lVar7 = CONCAT44(extraout_var,iVar4);
      puVar6[1] = lVar7;
      aVar1 = pvVar2[-1].val;
      *(undefined8 *)(lVar7 + 8) = *(undefined8 *)(pvVar2 + -1);
      *(anon_union_8_8_cb74652f_for_val *)(lVar7 + 0x10) = aVar1;
      *(re_compiled_pattern **)puVar6[1] = local_30;
      sp_ = sp_ + -1;
      return obj_id;
    }
    err_throw(0x900);
  }
  err_throw(0x7e3);
}

Assistant:

vm_obj_id_t CVmObjPattern::create_from_stack(VMG_ const uchar **pc_ptr,
                                             uint argc)
{
    const char *strval;
    re_status_t stat;
    re_compiled_pattern *pat;
    vm_obj_id_t id;

    /* check arguments */
    if (argc != 1)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* retrieve the string, but leave it on the stack */
    strval = G_stk->get(0)->get_as_string(vmg0_);
    if (strval == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* compile the string */
    stat = G_bif_tads_globals->rex_parser->compile_pattern(
        strval + VMB_LEN, vmb_get_len(strval), &pat);

    /* if we failed to compile the pattern, throw an error */
    if (stat != RE_STATUS_SUCCESS)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* create a new pattern object to hold the pattern */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    new (vmg_ id) CVmObjPattern(vmg_ pat, G_stk->get(0));

    /* discard arguments */
    G_stk->discard();

    /* return the new object */
    return id;
}